

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaStr.c
# Opt level: O1

int Str_MuxFindPath_rec(Str_Mux_t *pMux,int *pPath,int *pnLength)

{
  int iVar1;
  int iVar2;
  int *piVar3;
  long lVar4;
  int iVar5;
  
  piVar3 = &pMux->Edge[0].FanDel;
  iVar2 = pMux->Edge[0].FanDel;
  iVar5 = pMux->Edge[1].FanDel;
  iVar1 = pMux->Edge[2].FanDel;
  if (iVar5 <= iVar1) {
    iVar5 = iVar1;
  }
  if (iVar5 < iVar2) {
    iVar5 = iVar2;
  }
  lVar4 = 0;
  do {
    if (*piVar3 == iVar5) {
      iVar2 = Str_MuxFindPathEdge_rec(pMux,(int)lVar4,pPath,pnLength);
      return iVar2;
    }
    lVar4 = lVar4 + 1;
    piVar3 = piVar3 + 4;
  } while (lVar4 == 1);
  if (iVar1 == iVar5) {
    return 0;
  }
  __assert_fail("0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaStr.c"
                ,0x658,"int Str_MuxFindPath_rec(Str_Mux_t *, int *, int *)");
}

Assistant:

int Str_MuxFindPath_rec( Str_Mux_t * pMux, int * pPath, int * pnLength )
{
    int i, DelayMax = Abc_MaxInt( pMux->Edge[0].FanDel, Abc_MaxInt(pMux->Edge[1].FanDel, pMux->Edge[2].FanDel) );
    for ( i = 0; i < 2; i++ )
        if ( pMux->Edge[i].FanDel == DelayMax )
            return Str_MuxFindPathEdge_rec( pMux, i, pPath, pnLength );
    if ( pMux->Edge[2].FanDel == DelayMax )
        return 0;
    assert( 0 );
    return -1;
}